

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O3

void * Mpm_ManFromIfLogic(Mpm_Man_t *pMan)

{
  Mig_Fan_t MVar1;
  void *pvVar2;
  Mpm_Par_t *pMVar3;
  Vec_Mem_t *pVVar4;
  Gia_Obj_t *pGVar5;
  Mig_Fan_t *pMVar6;
  int iVar7;
  Mig_Fan_t MVar8;
  uint uVar9;
  Vec_Int_t *p;
  int *piVar10;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  Vec_Int_t *vCover;
  Vec_Int_t *p_02;
  Vec_Int_t *vLeavesTemp;
  Mpm_Cut_t *pCut;
  ulong uVar11;
  Gia_Obj_t *pGVar12;
  uint uVar13;
  long lVar14;
  int Fill;
  int Fill_00;
  long lVar15;
  Mig_Obj_t *pObj;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  Mig_Man_t *pMVar19;
  word *local_50;
  word uTruth;
  
  iVar16 = pMan->pMig->nObjs;
  p = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar7 = iVar16;
  }
  p->nCap = iVar7;
  if (iVar7 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc((long)iVar7 << 2);
  }
  p->pArray = piVar10;
  p->nSize = iVar16;
  memset(piVar10,0,(long)iVar16 << 2);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  piVar10 = (int *)malloc(0x40);
  p_00->pArray = piVar10;
  p_00->nSize = 1;
  *piVar10 = 0;
  p_01 = Gia_ManStart(iVar16);
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar10 = (int *)malloc(0x40000);
  vCover->pArray = piVar10;
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 0x10;
  p_02->nSize = 0;
  piVar10 = (int *)malloc(0x40);
  p_02->pArray = piVar10;
  vLeavesTemp = (Vec_Int_t *)malloc(0x10);
  vLeavesTemp->nCap = 0x10;
  vLeavesTemp->nSize = 0;
  piVar10 = (int *)malloc(0x40);
  vLeavesTemp->pArray = piVar10;
  pMVar19 = pMan->pMig;
  if ((pMVar19->vCopies).pArray == (int *)0x0) {
    uVar13 = pMVar19->nObjs;
    if ((pMVar19->vCopies).nCap < (int)uVar13) {
      piVar10 = (int *)malloc((long)(int)uVar13 << 2);
      (pMVar19->vCopies).pArray = piVar10;
      if (piVar10 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pMVar19->vCopies).nCap = uVar13;
    }
    else {
      piVar10 = (int *)0x0;
    }
    if (0 < (int)uVar13) {
      memset(piVar10,0xff,(ulong)uVar13 * 4);
    }
    (pMVar19->vCopies).nSize = uVar13;
  }
  pMVar19->iPage = 0;
  if ((pMVar19->vPages).nSize < 1) {
LAB_004024a1:
    if (vCover->pArray != (int *)0x0) {
      free(vCover->pArray);
    }
    free(vCover);
    if (p_02->pArray != (int *)0x0) {
      free(p_02->pArray);
    }
    free(p_02);
    if (vLeavesTemp->pArray != (int *)0x0) {
      free(vLeavesTemp->pArray);
    }
    free(vLeavesTemp);
    iVar16 = p_01->nObjs;
    if (iVar16 < p->nSize) {
      p->nSize = iVar16;
    }
    else {
      Vec_IntFillExtra(p,iVar16,Fill_00);
      iVar16 = p_01->nObjs;
      if (p->nSize != iVar16) {
        __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                      ,0x12d,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
      }
    }
    if (0 < iVar16) {
      piVar10 = p->pArray;
      lVar14 = 0;
      do {
        iVar7 = piVar10[lVar14];
        if (0 < iVar7) {
          piVar10[lVar14] = iVar7 + p_01->nObjs;
          iVar16 = p->nSize;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < iVar16);
    }
    if (0 < p_00->nSize) {
      lVar14 = 0;
      do {
        Vec_IntPush(p,p_00->pArray[lVar14]);
        lVar14 = lVar14 + 1;
      } while (lVar14 < p_00->nSize);
    }
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
    }
    free(p_00);
    if (p_01->vMapping != (Vec_Int_t *)0x0) {
      __assert_fail("pNew->vMapping == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                    ,0x134,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
    }
    if (p_01->vPacking != (Vec_Int_t *)0x0) {
      __assert_fail("pNew->vPacking == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                    ,0x135,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
    }
    p_01->vMapping = p;
    lVar14 = (long)p_01->vCos->nSize;
    if (0 < lVar14) {
      lVar15 = 0;
      do {
        iVar16 = p_01->vCos->pArray[lVar15];
        if (((long)iVar16 < 0) || (p_01->nObjs <= iVar16)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p_01->pObjs == (Gia_Obj_t *)0x0) {
          return p_01;
        }
        pGVar5 = p_01->pObjs + iVar16;
        uVar9 = (uint)*(undefined8 *)pGVar5;
        uVar13 = *(uint *)(pGVar5 + -(ulong)(uVar9 & 0x1fffffff));
        if ((~uVar13 & 0x1fffffff) != 0 && -1 < (int)uVar13) {
          uVar13 = iVar16 - (uVar9 & 0x1fffffff);
          if (((int)uVar13 < 0) || (p->nSize <= (int)uVar13)) {
LAB_004026bf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (p->pArray[uVar13] == 0) {
            __assert_fail("!Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                          ,0x13c,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar14 != lVar15);
    }
    return p_01;
  }
  local_50 = &uTruth;
  uVar13 = 0;
  do {
    if ((int)uVar13 < 0) {
LAB_004026a0:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pObj = (Mig_Obj_t *)(pMVar19->vPages).pArray[uVar13];
    pMVar19->pPage = pObj;
    if (pObj == (Mig_Obj_t *)0x0) goto LAB_004024a1;
    MVar8 = pObj->pFans[3];
    if ((uint)MVar8 < 0xfffffffe) {
      do {
        pMVar6 = pObj->pFans + 3;
        uVar13 = (uint)MVar8 >> 1;
        if ((pMan->vMapRefs).nSize <= (int)uVar13) goto LAB_004026bf;
        if ((pMan->vMapRefs).pArray[uVar13] == 0) {
          if ((0xfffffffd < (uint)pObj->pFans[1]) && ((uint)pObj->pFans[2] < 0xfffffffe))
          goto LAB_00401fcc;
        }
        else {
          if ((uint)pObj->pFans[1] < 0xfffffffe) {
            p_02->nSize = 0;
            pCut = Mpm_ObjCutBestP(pMan,(Mig_Obj_t *)(ulong)(uint)*pMVar6);
            uVar13 = *(uint *)&pCut->field_0x4;
            if (0x7ffffff < uVar13) {
              uVar17 = 0;
              do {
                uVar9 = pCut->pLeaves[uVar17];
                if ((int)uVar9 < 0) goto LAB_00402662;
                pMVar19 = pMan->pMig;
                if (pMVar19->nObjs <= (int)(uVar9 >> 1)) goto LAB_004026de;
                if ((pMVar19->vPages).nSize <= (int)(uVar9 >> 0xd)) goto LAB_004026a0;
                pvVar2 = (pMVar19->vPages).pArray[uVar9 >> 0xd];
                if (pvVar2 == (void *)0x0) break;
                uVar11 = (ulong)((uVar9 >> 1 & 0xfff) << 4);
                uVar13 = *(uint *)((long)pvVar2 + uVar11 + 0xc) >> 1;
                lVar14 = *(long *)((long)pvVar2 + (uVar11 - ((uVar13 & 0xfff) << 4)) + -0x10);
                iVar16 = *(int *)(lVar14 + 0x9c);
                if (iVar16 == 0) {
                  iVar16 = -1;
                }
                else {
                  if (iVar16 <= (int)uVar13) goto LAB_004026bf;
                  iVar16 = *(int *)(*(long *)(lVar14 + 0xa0) + (ulong)uVar13 * 4);
                }
                Vec_IntPush(p_02,iVar16);
                uVar17 = uVar17 + 1;
                uVar13 = *(uint *)&pCut->field_0x4;
              } while (uVar17 < uVar13 >> 0x1b);
            }
            pMVar3 = pMan->pPars;
            if (pMVar3->fDeriveLuts == 0) {
LAB_00402354:
              uVar13 = Mpm_ManNodeIfToGia(p_01,pMan,pObj,p_02,0);
              if ((int)uVar13 < 0) {
LAB_00402662:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf2,"int Abc_Lit2Var(int)");
              }
              uVar9 = uVar13 >> 1;
              iVar16 = p_00->nSize;
              Vec_IntFillExtra(p,uVar9 + 1,Fill);
              if (p->nSize <= (int)uVar9) goto LAB_004026fd;
              p->pArray[uVar9] = iVar16;
              Vec_IntPush(p_00,p_02->nSize);
              iVar16 = p_02->nSize;
              if (0 < (long)iVar16) {
                lVar14 = 0;
                do {
                  if (p_02->pArray[lVar14] < 0) goto LAB_00402662;
                  if (uVar9 <= (uint)p_02->pArray[lVar14] >> 1) {
                    __assert_fail("Abc_Lit2Var(Entry) < Abc_Lit2Var(iLitNew)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                                  ,0x10e,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
                  }
                  lVar14 = lVar14 + 1;
                } while (iVar16 != lVar14);
                if (0 < iVar16) {
                  lVar14 = 0;
                  do {
                    if (p_02->pArray[lVar14] < 0) goto LAB_00402662;
                    Vec_IntPush(p_00,(uint)p_02->pArray[lVar14] >> 1);
                    lVar14 = lVar14 + 1;
                  } while (lVar14 < p_02->nSize);
                }
              }
              Vec_IntPush(p_00,uVar9);
            }
            else {
              if (pMVar3->fUseTruth == 0) {
                if (pMVar3->fUseDsd == 0) goto LAB_00402354;
                uTruth = Mpm_CutTruthFromDsd(pMan,pCut,uVar13 >> 1 & 0xffffff);
              }
              else {
                uVar13 = uVar13 >> 1 & 0xffffff;
                pVVar4 = pMan->vTtMem;
                if (pVVar4->nEntries <= (int)uVar13) {
                  __assert_fail("i >= 0 && i < p->nEntries",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                                ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                }
                local_50 = pVVar4->ppPages[uVar13 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
                           (ulong)(pVVar4->PageMask & uVar13) * (long)pVVar4->nEntrySize;
              }
              uVar13 = Gia_ManFromIfLogicNode
                                 ((void *)0x0,p_01,(uint)*pMVar6 >> 1,p_02,vLeavesTemp,local_50,
                                  (char *)0x0,vCover,p,p_00,(Vec_Int_t *)0x0,0,0);
              if ((int)uVar13 < 0) goto LAB_0040275a;
              uVar13 = (*(uint *)&pCut->field_0x4 >> 0x19 ^ *(uint *)&pCut->field_0x4) & 1 ^ uVar13;
            }
          }
          else {
LAB_00401fcc:
            if ((uint)pObj->pFans[2] < 0xfffffffe) {
              if ((uint)pObj->pFans[0] < 0xfffffffe) {
                MVar1 = pObj->pFans[0];
                if (0x7ffffffe < (uint)MVar1 >> 1) goto LAB_00401fd7;
                uVar9 = (uint)MVar1 >> 1;
                if (uVar13 <= uVar9) {
                  __assert_fail("i < 3 && Mig_FanId(p, i) < Mig_ObjId(p)",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                                ,0xaa,"int Mig_ObjFaninId(Mig_Obj_t *, int)");
                }
                lVar14 = *(long *)((long)pObj + (-0x10 - (ulong)((uVar13 & 0xfff) << 4)));
                if (*(int *)(lVar14 + 8) <= (int)uVar9) {
LAB_004026de:
                  __assert_fail("v >= 0 && v < p->nObjs",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                                ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
                }
                if (*(int *)(lVar14 + 0x1c) <= (int)((uint)MVar1 >> 0xd)) goto LAB_004026a0;
                lVar14 = *(long *)(*(long *)(lVar14 + 0x20) + (ulong)((uint)MVar1 >> 0xd) * 8);
                uVar17 = (ulong)((uVar9 & 0xfff) << 4);
                uVar13 = *(uint *)(lVar14 + 0xc + uVar17) >> 1;
                lVar14 = *(long *)(((lVar14 + uVar17) - (ulong)((uVar13 & 0xfff) << 4)) + -0x10);
                iVar16 = *(int *)(lVar14 + 0x9c);
                if (iVar16 == 0) {
LAB_0040275a:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf5,"int Abc_LitNotCond(int, int)");
                }
                if (iVar16 <= (int)uVar13) goto LAB_004026bf;
                uVar13 = *(uint *)(*(long *)(lVar14 + 0xa0) + (ulong)uVar13 * 4);
                if ((int)uVar13 < 0) goto LAB_0040275a;
                uVar9 = uVar13 >> 1;
                if (p_01->nObjs <= (int)uVar9) {
                  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                                ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
                }
                if ((~*(uint *)(p_01->pObjs + uVar9) & 0x1fffffff) != 0 &&
                    (int)*(uint *)(p_01->pObjs + uVar9) < 0) {
                  __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                                ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
                }
                pGVar12 = Gia_ManAppendObj(p_01);
                uVar17 = *(ulong *)pGVar12;
                *(ulong *)pGVar12 = uVar17 | 0x80000000;
                pGVar5 = p_01->pObjs;
                if ((pGVar12 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar12)) goto LAB_0040273b;
                uVar11 = (ulong)(((uint)((int)pGVar12 - (int)pGVar5) >> 2) * -0x55555555 - uVar9 &
                                0x1fffffff);
                uVar18 = (ulong)(((uVar13 ^ (uint)MVar1) & 1) << 0x1d);
                *(ulong *)pGVar12 = uVar18 | uVar17 & 0xffffffffc0000000 | 0x80000000 | uVar11;
                *(ulong *)pGVar12 =
                     uVar18 | uVar17 & 0xe0000000c0000000 | 0x80000000 | uVar11 |
                     (ulong)(p_01->vCos->nSize & 0x1fffffff) << 0x20;
                pGVar5 = p_01->pObjs;
                if ((pGVar12 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar12)) goto LAB_0040273b;
                Vec_IntPush(p_01->vCos,
                            (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
                if (p_01->pFanData != (int *)0x0) {
                  Gia_ObjAddFanout(p_01,pGVar12 + -(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff
                                                          ),pGVar12);
                }
                pGVar5 = p_01->pObjs;
                if ((pGVar12 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar12)) goto LAB_0040273b;
                uVar13 = (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * 0x55555556;
              }
              else {
                pGVar12 = Gia_ManAppendObj(p_01);
                uVar17 = *(ulong *)pGVar12;
                *(ulong *)pGVar12 = uVar17 | 0x9fffffff;
                *(ulong *)pGVar12 =
                     uVar17 & 0xe0000000ffffffff | 0x9fffffff |
                     (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
                pGVar5 = p_01->pObjs;
                if ((pGVar12 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar12)) {
LAB_0040273b:
                  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
                }
                Vec_IntPush(p_01->vCis,
                            (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
                pGVar5 = p_01->pObjs;
                if ((pGVar12 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar12)) goto LAB_0040273b;
                uVar13 = (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * 0x55555556;
              }
            }
            else {
LAB_00401fd7:
              if (1 < (uint)MVar8) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                              ,0x120,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
              }
              if (p->nSize < 1) goto LAB_004026fd;
              *p->pArray = p_00->nSize;
              uVar13 = 0;
              Vec_IntPush(p_00,0);
              Vec_IntPush(p_00,0);
            }
          }
          uVar9 = (uint)*pMVar6 >> 1;
          lVar14 = *(long *)((long)pObj + (-0x10 - (ulong)((uVar9 & 0xfff) << 4)));
          iVar16 = *(int *)(lVar14 + 0x9c);
          if (iVar16 == 0) {
            __assert_fail("Vec_IntSize(&Mig_ObjMan(p)->vCopies) != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                          ,0xc3,"void Mig_ObjSetCopy(Mig_Obj_t *, int)");
          }
          if (iVar16 <= (int)uVar9) {
LAB_004026fd:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(uint *)(*(long *)(lVar14 + 0xa0) + (ulong)uVar9 * 4) = uVar13;
        }
        MVar8 = pObj[1].pFans[3];
        pObj = pObj + 1;
      } while ((uint)MVar8 < 0xfffffffe);
      pMVar19 = pMan->pMig;
    }
    uVar13 = pMVar19->iPage + 1;
    pMVar19->iPage = uVar13;
    if ((pMVar19->vPages).nSize <= (int)uVar13) goto LAB_004024a1;
  } while( true );
}

Assistant:

void * Mpm_ManFromIfLogic( Mpm_Man_t * pMan )
{
    Gia_Man_t * pNew;
    Mpm_Cut_t * pCutBest;
    Mig_Obj_t * pObj, * pFanin;
    Vec_Int_t * vMapping, * vMapping2, * vPacking = NULL;
    Vec_Int_t * vLeaves, * vLeaves2, * vCover;
    word uTruth, * pTruth = &uTruth;
    int i, k, Entry, iLitNew;
//    assert( !pMan->pPars->fDeriveLuts || pMan->pPars->fTruth );
    // start mapping and packing
    vMapping  = Vec_IntStart( Mig_ManObjNum(pMan->pMig) );
    vMapping2 = Vec_IntStart( 1 );
    if ( 0 ) // pMan->pPars->fDeriveLuts && pMan->pPars->pLutStruct )
    {
        vPacking = Vec_IntAlloc( 1000 );
        Vec_IntPush( vPacking, 0 );
    }
    // create new manager
    pNew = Gia_ManStart( Mig_ManObjNum(pMan->pMig) );
    // iterate through nodes used in the mapping
    vCover   = Vec_IntAlloc( 1 << 16 );
    vLeaves  = Vec_IntAlloc( 16 );
    vLeaves2 = Vec_IntAlloc( 16 );
    Mig_ManCleanCopy( pMan->pMig );
    Mig_ManForEachObj( pMan->pMig, pObj )
    {
        if ( !Mpm_ObjMapRef(pMan, pObj) && !Mig_ObjIsTerm(pObj) )
            continue;
        if ( Mig_ObjIsNode(pObj) )
        {
            // collect leaves of the best cut
            Vec_IntClear( vLeaves );
            pCutBest = Mpm_ObjCutBestP( pMan, pObj );
            Mpm_CutForEachLeaf( pMan->pMig, pCutBest, pFanin, k )
                Vec_IntPush( vLeaves, Mig_ObjCopy(pFanin) );
            if ( pMan->pPars->fDeriveLuts && (pMan->pPars->fUseTruth || pMan->pPars->fUseDsd) )
            {
                extern int Gia_ManFromIfLogicNode( void * p, Gia_Man_t * pNew, int iObj, Vec_Int_t * vLeaves, Vec_Int_t * vLeavesTemp, 
                    word * pRes, char * pStr, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking, int fCheck75, int fCheck44e );
                if ( pMan->pPars->fUseTruth )
                    pTruth = Mpm_CutTruth(pMan, Abc_Lit2Var(pCutBest->iFunc));
                else
                    uTruth = Mpm_CutTruthFromDsd( pMan, pCutBest, Abc_Lit2Var(pCutBest->iFunc) );
//                Kit_DsdPrintFromTruth( pTruth, Vec_IntSize(vLeaves) );  printf( "\n" );
                // perform decomposition of the cut
                iLitNew = Gia_ManFromIfLogicNode( NULL, pNew, Mig_ObjId(pObj), vLeaves, vLeaves2, pTruth, NULL, vCover, vMapping, vMapping2, vPacking, 0, 0 );
                iLitNew = Abc_LitNotCond( iLitNew, pCutBest->fCompl ^ Abc_LitIsCompl(pCutBest->iFunc) );
            }
            else
            {
                // perform one of the two types of mapping: with and without structures
                iLitNew = Mpm_ManNodeIfToGia( pNew, pMan, pObj, vLeaves, 0 );
                // write mapping
                Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLitNew), Vec_IntSize(vMapping2) );
                Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    assert( Abc_Lit2Var(Entry) < Abc_Lit2Var(iLitNew) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    Vec_IntPush( vMapping2, Abc_Lit2Var(Entry)  );
                Vec_IntPush( vMapping2, Abc_Lit2Var(iLitNew) );
            }
        }
        else if ( Mig_ObjIsCi(pObj) )
            iLitNew = Gia_ManAppendCi(pNew);
        else if ( Mig_ObjIsCo(pObj) )
            iLitNew = Gia_ManAppendCo( pNew, Abc_LitNotCond(Mig_ObjCopy(Mig_ObjFanin0(pObj)), Mig_ObjFaninC0(pObj)) );
        else if ( Mig_ObjIsConst0(pObj) )
        {
            iLitNew = 0;
            // create const LUT
            Vec_IntWriteEntry( vMapping, 0, Vec_IntSize(vMapping2) );
            Vec_IntPush( vMapping2, 0 );
            Vec_IntPush( vMapping2, 0 );
        }
        else assert( 0 );
        Mig_ObjSetCopy( pObj, iLitNew );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vLeaves2 );
//    printf( "Mapping array size:  IfMan = %d. Gia = %d. Increase = %.2f\n", 
//        Mig_ManObjNum(pMan), Gia_ManObjNum(pNew), 1.0 * Gia_ManObjNum(pNew) / Mig_ManObjNum(pMan) );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, Entry, i )
        if ( Entry > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    assert( pNew->vPacking == NULL );
    pNew->vMapping = vMapping;
    pNew->vPacking = vPacking;
    // verify that COs have mapping
    {
        Gia_Obj_t * pObj;
        Gia_ManForEachCo( pNew, pObj, i )
           assert( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj)) );
    }
    return pNew;
}